

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O1

void __thiscall
cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
          (cmGeneratorExpressionDAGChecker *this,cmListFileBacktrace *backtrace,string *target,
          string *property,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *parent)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  this->Parent = parent;
  (this->Target)._M_dataplus._M_p = (pointer)&(this->Target).field_2;
  pcVar2 = (target->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Target,pcVar2,pcVar2 + target->_M_string_length);
  (this->Property)._M_dataplus._M_p = (pointer)&(this->Property).field_2;
  pcVar2 = (property->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Property,pcVar2,pcVar2 + property->_M_string_length);
  p_Var1 = &(this->Seen)._M_t._M_impl.super__Rb_tree_header;
  (this->Seen)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Seen)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Seen)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Seen)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Seen)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->Content = content;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,backtrace);
  this->TransitivePropertiesOnly = false;
  Initialize(this);
  return;
}

Assistant:

cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker(
  const cmListFileBacktrace& backtrace, const std::string& target,
  const std::string& property, const GeneratorExpressionContent* content,
  cmGeneratorExpressionDAGChecker* parent)
  : Parent(parent)
  , Target(target)
  , Property(property)
  , Content(content)
  , Backtrace(backtrace)
  , TransitivePropertiesOnly(false)
{
  Initialize();
}